

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_hasher.hpp
# Opt level: O0

void __thiscall Fossilize::Hasher::f32(Hasher *this,float value)

{
  anon_union_4_2_43a84cd0 u;
  float value_local;
  Hasher *this_local;
  
  u32(this,(uint32_t)value);
  return;
}

Assistant:

inline void f32(float value)
	{
		union
		{
			float f32;
			uint32_t u32;
		} u;
		u.f32 = value;
		u32(u.u32);
	}